

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O3

ssize_t refill_buffer(hFILE *fp)

{
  char *pcVar1;
  char *__src;
  ssize_t sVar2;
  int *piVar3;
  
  pcVar1 = fp->buffer;
  __src = fp->begin;
  if (pcVar1 <= __src && (long)__src - (long)pcVar1 != 0) {
    fp->offset = fp->offset + ((long)__src - (long)pcVar1);
    memmove(pcVar1,__src,(long)fp->end - (long)__src);
    fp->end = fp->buffer + ((long)fp->end - (long)fp->begin);
    fp->begin = fp->buffer;
  }
  if ((fp->field_0x30 & 1) == 0) {
    pcVar1 = fp->end;
    if (pcVar1 != fp->limit) {
      sVar2 = (*fp->backend->read)(fp,pcVar1,(long)fp->limit - (long)pcVar1);
      if (sVar2 < 0) {
        piVar3 = __errno_location();
        fp->has_errno = *piVar3;
        return sVar2;
      }
      if (sVar2 != 0) goto LAB_00111fcc;
      fp->field_0x30 = fp->field_0x30 | 1;
    }
  }
  sVar2 = 0;
LAB_00111fcc:
  fp->end = fp->end + sVar2;
  return sVar2;
}

Assistant:

static ssize_t refill_buffer(hFILE *fp)
{
    ssize_t n;

    // Move any unread characters to the start of the buffer
    if (fp->begin > fp->buffer) {
        fp->offset += fp->begin - fp->buffer;
        memmove(fp->buffer, fp->begin, fp->end - fp->begin);
        fp->end = &fp->buffer[fp->end - fp->begin];
        fp->begin = fp->buffer;
    }

    // Read into the available buffer space at fp->[end,limit)
    if (fp->at_eof || fp->end == fp->limit) n = 0;
    else {
        n = fp->backend->read(fp, fp->end, fp->limit - fp->end);
        if (n < 0) { fp->has_errno = errno; return n; }
        else if (n == 0) fp->at_eof = 1;
    }

    fp->end += n;
    return n;
}